

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O3

int cfg_db_remove_entry(cfg_db *db,char *section_type,char *section_name,char *entry_name)

{
  int iVar1;
  cfg_entry *entry;
  
  entry = cfg_db_find_entry(db,section_type,section_name,entry_name);
  if (entry == (cfg_entry *)0x0) {
    iVar1 = -1;
  }
  else {
    _free_entry(entry);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
cfg_db_remove_entry(struct cfg_db *db, const char *section_type, const char *section_name, const char *entry_name) {
  struct cfg_entry *entry;

  /* get entry */
  entry = cfg_db_find_entry(db, section_type, section_name, entry_name);
  if (entry == NULL) {
    /* entry not there */
    return -1;
  }

  _free_entry(entry);
  return 0;
}